

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void test1(void)

{
  int *piVar1;
  int iVar2;
  socklen_t in_ECX;
  sigslot<void_()> sig;
  undefined1 auStack_98 [24];
  undefined1 auStack_80 [16];
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  sigslot<void_()> local_48;
  
  local_48.m_slots.
  super__List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48.m_slots.
  super__List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_48.m_mutex.super___mutex_base._M_mutex.__align = 0;
  local_48.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  local_48.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  local_48.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  local_48.m_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  auStack_98._16_8_ = 0;
  auStack_80._0_8_ = 0;
  local_70 = std::_Function_handler<void_(),_HelloWorld>::_M_invoke;
  auStack_80._8_8_ = std::_Function_handler<void_(),_HelloWorld>::_M_manager;
  local_68 = (__pthread_internal_list *)0x0;
  uStack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = 0;
  local_48.m_slots.
  super__List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_48.m_slots.
       super__List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  utils::sigslot<void_()>::connect
            ((sigslot<void_()> *)auStack_98,
             (int)local_48.m_slots.
                  super__List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next,(sockaddr *)(auStack_98 + 0x10),
             in_ECX);
  if ((_List_node_base *)auStack_98._8_8_ != (_List_node_base *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)(auStack_98._8_8_ + 8) + 4);
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = *(int *)((long)(auStack_98._8_8_ + 8) + 4);
      *(int *)((long)(auStack_98._8_8_ + 8) + 4) = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(code *)(*(_List_node_base **)auStack_98._8_8_)[1]._M_prev)();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_60 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_60);
  }
  if ((code *)auStack_80._8_8_ != (code *)0x0) {
    (*(code *)auStack_80._8_8_)(auStack_98 + 0x10,auStack_98 + 0x10,3);
  }
  utils::sigslot<void_()>::operator()<>(&local_48);
  std::__cxx11::
  _List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
  ::_M_clear((_List_base<std::shared_ptr<utils::detail::slot<void_()>_>,_std::allocator<std::shared_ptr<utils::detail::slot<void_()>_>_>_>
              *)&local_48);
  return;
}

Assistant:

void test1()
{
    utils::sigslot<void()> sig;
    HelloWorld hello;
    sig.connect(hello);
    sig();
}